

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLock.cxx
# Opt level: O2

void __thiscall cmFileLock::~cmFileLock(cmFileLock *this)

{
  bool bVar1;
  cmFileLockResult result;
  
  if ((this->Filename)._M_string_length != 0) {
    result = Release(this);
    bVar1 = cmFileLockResult::IsOk(&result);
    if (!bVar1) {
      __assert_fail("result.IsOk()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileLock.cxx"
                    ,0x1c,"cmFileLock::~cmFileLock()");
    }
  }
  std::__cxx11::string::~string((string *)&this->Filename);
  return;
}

Assistant:

cmFileLock::~cmFileLock()
{
  if (!this->Filename.empty()) {
    const cmFileLockResult result = this->Release();
    static_cast<void>(result);
    assert(result.IsOk());
  }
}